

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O3

void Kit_TruthCofactor1New(uint *pOut,uint *pIn,int nVars,int iVar)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  uint *puVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint *puVar8;
  int iVar9;
  
  uVar5 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar5 = 1;
  }
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                  ,0x242,"void Kit_TruthCofactor1New(unsigned int *, unsigned int *, int, int)");
  }
  switch(iVar) {
  case 0:
    if (0 < (int)uVar5) {
      uVar2 = 0;
      do {
        pOut[uVar2] = (pIn[uVar2] & 0xaaaaaaaa) >> 1 | pIn[uVar2] & 0xaaaaaaaa;
        uVar2 = uVar2 + 1;
      } while (uVar5 != uVar2);
    }
    break;
  case 1:
    if (0 < (int)uVar5) {
      uVar2 = 0;
      do {
        pOut[uVar2] = (pIn[uVar2] & 0xcccccccc) >> 2 | pIn[uVar2] & 0xcccccccc;
        uVar2 = uVar2 + 1;
      } while (uVar5 != uVar2);
    }
    break;
  case 2:
    if (0 < (int)uVar5) {
      uVar2 = 0;
      do {
        pOut[uVar2] = (pIn[uVar2] & 0xf0f0f0f0) >> 4 | pIn[uVar2] & 0xf0f0f0f0;
        uVar2 = uVar2 + 1;
      } while (uVar5 != uVar2);
    }
    break;
  case 3:
    if (0 < (int)uVar5) {
      uVar2 = 0;
      do {
        pOut[uVar2] = (pIn[uVar2] & 0xff00ff00) >> 8 | pIn[uVar2] & 0xff00ff00;
        uVar2 = uVar2 + 1;
      } while (uVar5 != uVar2);
    }
    break;
  case 4:
    if (0 < (int)uVar5) {
      uVar2 = 0;
      do {
        pOut[uVar2] = pIn[uVar2] >> 0x10 | pIn[uVar2] & 0xffff0000;
        uVar2 = uVar2 + 1;
      } while (uVar5 != uVar2);
    }
    break;
  default:
    if (0 < (int)uVar5) {
      bVar1 = (byte)(iVar + -5);
      uVar7 = 1 << (bVar1 & 0x1f);
      iVar6 = 2 << (bVar1 & 0x1f);
      uVar2 = 1;
      if (1 < (int)uVar7) {
        uVar2 = (ulong)uVar7;
      }
      puVar4 = pIn + (int)uVar7;
      puVar8 = pOut + (int)uVar7;
      iVar9 = 0;
      do {
        if (iVar + -5 != 0x1f) {
          uVar3 = 0;
          do {
            uVar7 = puVar4[uVar3];
            puVar8[uVar3] = uVar7;
            pOut[uVar3] = uVar7;
            uVar3 = uVar3 + 1;
          } while (uVar2 != uVar3);
        }
        iVar9 = iVar9 + iVar6;
        puVar4 = puVar4 + iVar6;
        puVar8 = puVar8 + iVar6;
        pOut = pOut + iVar6;
      } while (iVar9 < (int)uVar5);
    }
  }
  return;
}

Assistant:

void Kit_TruthCofactor1New( unsigned * pOut, unsigned * pIn, int nVars, int iVar )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Step;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0xAAAAAAAA) | ((pIn[i] & 0xAAAAAAAA) >> 1);
        return;
    case 1:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0xCCCCCCCC) | ((pIn[i] & 0xCCCCCCCC) >> 2);
        return;
    case 2:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0xF0F0F0F0) | ((pIn[i] & 0xF0F0F0F0) >> 4);
        return;
    case 3:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0xFF00FF00) | ((pIn[i] & 0xFF00FF00) >> 8);
        return;
    case 4:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0xFFFF0000) | ((pIn[i] & 0xFFFF0000) >> 16);
        return;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
                pOut[i] = pOut[Step+i] = pIn[Step+i];
            pIn += 2*Step;
            pOut += 2*Step;
        }
        return;
    }
}